

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

_Bool target_set_closest(wchar_t mode,monster_predicate pred)

{
  _Bool _Var1;
  int iVar2;
  point_set *ps;
  monster *m;
  point_set *targets;
  char m_name [80];
  monster *mon;
  monster_predicate pred_local;
  wchar_t mode_local;
  
  target_set_monster((monster *)0x0);
  ps = target_get_monsters(mode,pred,false);
  iVar2 = point_set_size((point_set_conflict *)ps);
  if (iVar2 < 1) {
    msg("No Available Target.");
    point_set_dispose((point_set_conflict *)ps);
    pred_local._7_1_ = false;
  }
  else {
    m = square_monster((chunk *)cave,*(loc_conflict *)ps->pts);
    _Var1 = target_able(m);
    if (_Var1) {
      monster_desc((char *)&targets,0x50,m,L'̀');
      if ((mode & 0x10U) == 0) {
        msg("%s is targeted.",&targets);
      }
      monster_race_track(player->upkeep,m->race);
      health_track(player->upkeep,m);
      target_set_monster(m);
      point_set_dispose((point_set_conflict *)ps);
      pred_local._7_1_ = true;
    }
    else {
      msg("No Available Target.");
      point_set_dispose((point_set_conflict *)ps);
      pred_local._7_1_ = false;
    }
  }
  return pred_local._7_1_;
}

Assistant:

bool target_set_closest(int mode, monster_predicate pred)
{
	struct monster *mon;
	char m_name[80];
	struct point_set *targets;

	/* Cancel old target */
	target_set_monster(NULL);

	/* Get ready to do targetting */
	targets = target_get_monsters(mode, pred, false);

	/* If nothing was prepared, then return */
	if (point_set_size(targets) < 1) {
		msg("No Available Target.");
		point_set_dispose(targets);
		return false;
	}

	/* Find the first monster in the queue */
	mon = square_monster(cave, targets->pts[0]);
	
	/* Target the monster, if possible */
	if (!target_able(mon)) {
		msg("No Available Target.");
		point_set_dispose(targets);
		return false;
	}

	/* Target the monster */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_CAPITAL | MDESC_COMMA);
	if (!(mode & TARGET_QUIET))
		msg("%s is targeted.", m_name);

	/* Set up target information */
	monster_race_track(player->upkeep, mon->race);
	health_track(player->upkeep, mon);
	target_set_monster(mon);

	point_set_dispose(targets);
	return true;
}